

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O3

_Bool al_register_sample_loader(char *ext,_func_ALLEGRO_SAMPLE_ptr_char_ptr *loader)

{
  _Bool _Var1;
  size_t sVar2;
  ACODEC_TABLE *__dest;
  
  sVar2 = strlen(ext);
  if (sVar2 - 0x1f < 0xffffffffffffffe0) {
LAB_00107366:
    _Var1 = false;
  }
  else {
    __dest = find_acodec_table_entry(ext);
    if (loader == (_func_ALLEGRO_SAMPLE_ptr_char_ptr *)0x0) {
      if ((__dest == (ACODEC_TABLE *)0x0) ||
         (__dest->loader == (_func_ALLEGRO_SAMPLE_ptr_char_ptr *)0x0)) goto LAB_00107366;
    }
    else if (__dest == (ACODEC_TABLE *)0x0) {
      __dest = (ACODEC_TABLE *)_al_vector_alloc_back(&acodec_table);
      strcpy((char *)__dest,ext);
      __dest->loader = (_func_ALLEGRO_SAMPLE_ptr_char_ptr *)0x0;
      __dest->saver = (_func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *)0x0;
      __dest->stream_loader = (_func_ALLEGRO_AUDIO_STREAM_ptr_char_ptr_size_t_uint *)0x0;
      __dest->fs_loader = (_func_ALLEGRO_SAMPLE_ptr_ALLEGRO_FILE_ptr *)0x0;
      __dest->fs_saver = (_func__Bool_ALLEGRO_FILE_ptr_ALLEGRO_SAMPLE_ptr *)0x0;
      __dest->fs_stream_loader = (_func_ALLEGRO_AUDIO_STREAM_ptr_ALLEGRO_FILE_ptr_size_t_uint *)0x0;
    }
    __dest->loader = loader;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool al_register_sample_loader(const char *ext,
   ALLEGRO_SAMPLE *(*loader)(const char *filename))
{
   ACODEC_TABLE *ent;

   if (strlen(ext) + 1 >= MAX_EXTENSION_LENGTH) {
      return false;
   }

   ent = find_acodec_table_entry(ext);
   if (!loader) {
      if (!ent || !ent->loader) {
         return false; /* Nothing to remove. */
      }
   }
   else if (!ent) {
      ent = add_acodec_table_entry(ext);
   }

   ent->loader = loader;

   return true;
}